

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

DisplayItem *
pbrt::GetImageDisplayItem
          (DisplayItem *__return_storage_ptr__,string *title,Image *image,
          optional<pbrt::ImageChannelDesc> *channelDesc)

{
  Tuple2<pbrt::Point2,_int> resolution;
  ImageChannelDesc *desc;
  ulong uVar1;
  __0 *this;
  int *args;
  long lVar2;
  int local_250;
  allocator<char> local_24a;
  allocator<char> local_249;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Any_data local_208;
  code *pcStack_1f8;
  code *pcStack_1f0;
  string local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  anon_class_336_2_a11d6aed getValues;
  
  pstd::optional<pbrt::ImageChannelDesc>::optional(&getValues.channelDesc,channelDesc);
  Image::Image(&getValues.image,image);
  channelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (channelDesc->set == true) {
    desc = pstd::optional<pbrt::ImageChannelDesc>::value(channelDesc);
    Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1e0,image,desc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&channelNames,&local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e0);
  }
  else {
    uVar1 = (ulong)(uint)(image->channelNames).nStored;
    if (uVar1 == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"R",(allocator<char> *)&local_250);
      std::__cxx11::string::string<std::allocator<char>>(local_1c0,"G",&local_249);
      std::__cxx11::string::string<std::allocator<char>>(local_1a0,"B",&local_24a);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&channelNames,
                 &local_1e0,&getValues);
      lVar2 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1e0._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
    }
    else {
      args = (int *)0x0;
      while (local_250 = (int)args, local_250 < (int)uVar1) {
        StringPrintf<int&>(&local_1e0,(pbrt *)"channel %d",(char *)&local_250,args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &channelNames,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        uVar1 = (image->channelNames).nStored;
        args = (int *)(ulong)(local_250 + 1);
      }
    }
  }
  resolution = (image->resolution).super_Tuple2<pbrt::Point2,_int>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220,&channelNames);
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  pcStack_1f8 = (code *)0x0;
  pcStack_1f0 = (code *)0x0;
  this = (__0 *)operator_new(0x150);
  GetImageDisplayItem(std::__cxx11::string_const&,pbrt::Image_const&,pstd::optional<pbrt::ImageChannelDesc>)
  ::$_0::__0(this,&getValues);
  pcStack_1f0 = std::
                _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp:436:22)>
                ::_M_invoke;
  pcStack_1f8 = std::
                _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp:436:22)>
                ::_M_manager;
  local_208._M_unused._0_8_ = (undefined8)this;
  DisplayItem::DisplayItem
            (__return_storage_ptr__,title,(Point2i)resolution,&local_220,
             (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&channelNames);
  GetImageDisplayItem(std::__cxx11::string_const&,pbrt::Image_const&,pstd::optional<pbrt::ImageChannelDesc>)
  ::$_0::~__0((__0 *)&getValues);
  return __return_storage_ptr__;
}

Assistant:

static DisplayItem GetImageDisplayItem(const std::string &title, const Image &image,
                                       pstd::optional<ImageChannelDesc> channelDesc) {
    auto getValues = [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValues) {
        int offset = 0;
        for (Point2i p : b) {
            ImageChannelValues v =
                channelDesc ? image.GetChannels(p, *channelDesc) : image.GetChannels(p);
            for (int i = 0; i < v.size(); ++i)
                displayValues[i][offset] = v[i];
            ++offset;
        }
    };

    std::vector<std::string> channelNames;
    if (channelDesc)
        channelNames = image.ChannelNames(*channelDesc);
    else {
        if (image.NChannels() == 3)
            channelNames = {"R", "G", "B"};
        else
            for (int i = 0; i < image.NChannels(); ++i)
                channelNames.push_back(StringPrintf("channel %d", i));
    }

    return DisplayItem(title, image.Resolution(), channelNames, getValues);
}